

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::NetAlias>::emplace_back<slang::ast::NetAlias>
          (SmallVectorBase<slang::ast::NetAlias> *this,NetAlias *args)

{
  unsigned_long *puVar1;
  size_type sVar2;
  ulong uVar3;
  undefined8 *puVar4;
  ValueSymbol *pVVar5;
  Expression *pEVar6;
  unsigned_long uVar7;
  pointer pNVar8;
  pointer pNVar9;
  pointer pNVar10;
  pointer pNVar11;
  EVP_PKEY_CTX *pEVar12;
  EVP_PKEY_CTX *ctx;
  long lVar13;
  pointer pNVar14;
  
  pNVar14 = this->data_ + this->len;
  if (this->len != this->cap) {
    pVVar5 = (args->sym).ptr;
    pEVar6 = (args->expr).ptr;
    uVar7 = (args->bounds).second;
    (pNVar14->bounds).first = (args->bounds).first;
    (pNVar14->bounds).second = uVar7;
    (pNVar14->sym).ptr = pVVar5;
    (pNVar14->expr).ptr = pEVar6;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return this->data_ + sVar2;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar12 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar12 < ctx) {
    pEVar12 = ctx;
  }
  if (0x3ffffffffffffff - uVar3 < uVar3) {
    pEVar12 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar13 = (long)pNVar14 - (long)this->data_;
  pNVar8 = (pointer)operator_new((long)pEVar12 << 5);
  pVVar5 = (args->sym).ptr;
  pEVar6 = (args->expr).ptr;
  uVar7 = (args->bounds).second;
  puVar1 = (unsigned_long *)((long)pNVar8 + lVar13 + 0x10);
  *puVar1 = (args->bounds).first;
  puVar1[1] = uVar7;
  *(undefined8 *)((long)pNVar8 + lVar13) = pVVar5;
  ((undefined8 *)((long)pNVar8 + lVar13))[1] = pEVar6;
  pNVar11 = this->data_;
  pNVar9 = pNVar11 + this->len;
  pNVar10 = pNVar8;
  if (pNVar9 == pNVar14) {
    for (; pNVar11 != pNVar14; pNVar11 = pNVar11 + 1) {
      pVVar5 = (pNVar11->sym).ptr;
      pEVar6 = (pNVar11->expr).ptr;
      uVar7 = (pNVar11->bounds).second;
      (pNVar10->bounds).first = (pNVar11->bounds).first;
      (pNVar10->bounds).second = uVar7;
      (pNVar10->sym).ptr = pVVar5;
      (pNVar10->expr).ptr = pEVar6;
      pNVar10 = pNVar10 + 1;
    }
  }
  else {
    for (; pNVar11 != pNVar14; pNVar11 = pNVar11 + 1) {
      pVVar5 = (pNVar11->sym).ptr;
      pEVar6 = (pNVar11->expr).ptr;
      uVar7 = (pNVar11->bounds).second;
      (pNVar10->bounds).first = (pNVar11->bounds).first;
      (pNVar10->bounds).second = uVar7;
      (pNVar10->sym).ptr = pVVar5;
      (pNVar10->expr).ptr = pEVar6;
      pNVar10 = pNVar10 + 1;
    }
    puVar4 = (undefined8 *)(lVar13 + (long)pNVar8);
    for (; pNVar14 != pNVar9; pNVar14 = pNVar14 + 1) {
      pVVar5 = (pNVar14->sym).ptr;
      pEVar6 = (pNVar14->expr).ptr;
      uVar7 = (pNVar14->bounds).second;
      puVar4[6] = (pNVar14->bounds).first;
      puVar4[7] = uVar7;
      puVar4[4] = pVVar5;
      puVar4[5] = pEVar6;
      puVar4 = puVar4 + 4;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar12;
  this->data_ = pNVar8;
  return (reference)((long)pNVar8 + lVar13);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }